

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::create_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_01;
  float fVar1;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  long *plVar5;
  Allocator *pAVar6;
  iterator __position;
  int iVar7;
  Layer *pLVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  float fVar14;
  Mat int8_weight_data;
  Mat weight_data_g;
  Mat int8_weight_data_g;
  Option opt_q;
  void *ptr;
  Mat local_a38;
  Option *local_9f0;
  ModelBinFromMatArray local_9e8;
  undefined4 uStack_9d8;
  undefined4 uStack_9d4;
  int iStack_9d0;
  Allocator *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  long local_9b0;
  vector<float,std::allocator<float>> *local_9a0;
  void *local_998;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  int iStack_980;
  Allocator *local_978;
  undefined8 local_970;
  undefined8 uStack_968;
  long local_960;
  undefined4 local_958;
  int iStack_954;
  Allocator *pAStack_950;
  undefined4 local_948;
  undefined4 uStack_944;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined8 local_938;
  ParamDict local_930;
  
  sVar2 = (this->weight_data).elemsize;
  if ((sVar2 == 1) && (opt->use_int8_inference == false)) {
    create_pipeline();
    return -1;
  }
  if (opt->use_int8_inference == true && sVar2 == 4) {
    bVar9 = this->int8_scale_term != 0;
  }
  else {
    bVar9 = (bool)(sVar2 == 1 & opt->use_int8_inference);
  }
  this->use_int8_inference = bVar9;
  local_9f0 = opt;
  if ((sVar2 == 4) && (bVar9 != false)) {
    local_a38.w = this->weight_data_size;
    local_a38.cstep = (size_t)local_a38.w;
    local_a38.data = (void *)0x0;
    local_a38.refcount._0_4_ = 0;
    local_a38.refcount._4_4_ = 0;
    local_a38.refcount = (int *)0x0;
    local_a38.elemsize._0_4_ = 1;
    local_a38.elemsize._4_4_ = 0;
    local_a38.elempack = 1;
    local_a38.allocator = (Allocator *)0x0;
    local_a38.dims = 1;
    local_a38.h = 1;
    local_a38.c = 1;
    if (local_a38.w != 0) {
      uVar10 = local_a38.cstep + 3 & 0xfffffffffffffffc;
      local_930.params[0]._0_8_ = (void *)0x0;
      iVar7 = posix_memalign((void **)&local_930,0x10,uVar10 + 4);
      if (iVar7 != 0) {
        local_930.params[0]._0_8_ = (void *)0x0;
      }
      local_a38.data = (void *)local_930.params[0]._0_8_;
      local_a38.refcount = (int *)(local_930.params[0]._0_8_ + uVar10);
      *(undefined4 *)(local_930.params[0]._0_8_ + uVar10) = 1;
    }
    if (local_a38.data == (void *)0x0) {
      bVar9 = true;
    }
    else {
      bVar9 = (long)local_a38.c * local_a38.cstep == 0;
    }
    if (bVar9) {
      if (local_a38.refcount != (int *)0x0) {
        LOCK();
        *local_a38.refcount = *local_a38.refcount + -1;
        UNLOCK();
        if (*local_a38.refcount == 0) {
          if (local_a38.allocator == (Allocator *)0x0) {
            if (local_a38.data != (void *)0x0) {
              free(local_a38.data);
            }
          }
          else {
            (*(local_a38.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    local_9a0 = (vector<float,std::allocator<float>> *)((ulong)local_9a0 & 0xffffffffffffff00);
    iVar7 = this->weight_data_size / this->group;
    if (0 < this->group) {
      lVar12 = (long)iVar7;
      lVar11 = 0;
      do {
        pLVar8 = create_layer(0x39);
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,
                       *(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4));
        (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
        (*pLVar8->_vptr_Layer[4])(pLVar8,local_9f0);
        local_958 = *(undefined4 *)local_9f0;
        iStack_954 = local_9f0->num_threads;
        local_948 = *(undefined4 *)&local_9f0->workspace_allocator;
        uStack_944 = *(undefined4 *)((long)&local_9f0->workspace_allocator + 4);
        uStack_940._0_1_ = local_9f0->use_winograd_convolution;
        uStack_940._1_1_ = local_9f0->use_sgemm_convolution;
        uStack_940._2_1_ = local_9f0->use_int8_inference;
        uStack_940._3_1_ = local_9f0->use_vulkan_compute;
        uStack_93c._0_1_ = local_9f0->use_fp16_packed;
        uStack_93c._1_1_ = local_9f0->use_fp16_storage;
        uStack_93c._2_1_ = local_9f0->use_fp16_arithmetic;
        uStack_93c._3_1_ = local_9f0->use_int8_storage;
        local_938._0_1_ = local_9f0->use_int8_arithmetic;
        local_938._1_1_ = local_9f0->use_packing_layout;
        local_938._2_6_ = *(undefined6 *)&local_9f0->field_0x22;
        pAStack_950 = local_a38.allocator;
        sVar2 = (this->weight_data).elemsize;
        local_9e8.super_ModelBin._vptr_ModelBin =
             (_func_int **)(sVar2 * lVar11 * lVar12 + (long)(this->weight_data).data);
        iStack_9d0 = (this->weight_data).elempack;
        local_9c8 = (this->weight_data).allocator;
        local_9e8.weights._0_4_ = 0;
        local_9e8.weights._4_4_ = 0;
        uStack_9d8 = (undefined4)sVar2;
        uStack_9d4 = (undefined4)(sVar2 >> 0x20);
        local_9c0 = CONCAT44(iVar7,1);
        uStack_9b8 = 0x100000001;
        local_998 = (void *)(lVar11 * lVar12 *
                             CONCAT44(local_a38.elemsize._4_4_,(undefined4)local_a38.elemsize) +
                            (long)local_a38.data);
        uStack_990 = 0;
        uStack_98c = 0;
        uStack_988 = (undefined4)local_a38.elemsize;
        uStack_984 = local_a38.elemsize._4_4_;
        iStack_980 = local_a38.elempack;
        local_978 = local_a38.allocator;
        local_970 = CONCAT44(iVar7,1);
        uStack_968 = 0x100000001;
        local_9b0 = lVar12;
        local_960 = lVar12;
        (*pLVar8->_vptr_Layer[7])(pLVar8,&local_9e8,&local_998,&local_958);
        (*pLVar8->_vptr_Layer[1])(pLVar8);
        piVar3 = (int *)CONCAT44(uStack_98c,uStack_990);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_978 == (Allocator *)0x0) {
              if (local_998 != (void *)0x0) {
                free(local_998);
              }
            }
            else {
              (*local_978->_vptr_Allocator[3])();
            }
          }
        }
        uStack_988 = 0;
        uStack_984 = 0;
        iStack_980 = 0;
        local_998 = (void *)0x0;
        uStack_990 = 0;
        uStack_98c = 0;
        local_970 = 0;
        uStack_968 = 0;
        local_960 = 0;
        piVar3 = (int *)CONCAT44(local_9e8.weights._4_4_,local_9e8.weights._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_9c8 == (Allocator *)0x0) {
              if (local_9e8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                free(local_9e8.super_ModelBin._vptr_ModelBin);
              }
            }
            else {
              (*local_9c8->_vptr_Allocator[3])();
            }
          }
        }
        uStack_9d8 = 0;
        uStack_9d4 = 0;
        iStack_9d0 = 0;
        local_9e8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9e8.weights._0_4_ = 0;
        local_9e8.weights._4_4_ = 0;
        local_9c0 = 0;
        uStack_9b8 = 0;
        local_9b0 = 0;
        lVar13 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar13);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar13);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar13);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar13 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar13) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar13) = 0;
          lVar13 = lVar13 + -0x48;
        } while (lVar13 != -0x40);
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->group);
    }
    if (&this->weight_data != &local_a38) {
      if (local_a38.refcount != (int *)0x0) {
        LOCK();
        *local_a38.refcount = *local_a38.refcount + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar4 = (this->weight_data).data;
          pAVar6 = (this->weight_data).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
      *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
      (this->weight_data).data = (void *)0x0;
      (this->weight_data).refcount = (int *)0x0;
      (this->weight_data).dims = 0;
      (this->weight_data).w = 0;
      (this->weight_data).h = 0;
      (this->weight_data).c = 0;
      (this->weight_data).cstep = 0;
      (this->weight_data).data = local_a38.data;
      (this->weight_data).refcount = local_a38.refcount;
      (this->weight_data).elemsize =
           CONCAT44(local_a38.elemsize._4_4_,(undefined4)local_a38.elemsize);
      (this->weight_data).elempack = local_a38.elempack;
      (this->weight_data).allocator = local_a38.allocator;
      (this->weight_data).dims = local_a38.dims;
      (this->weight_data).w = local_a38.w;
      (this->weight_data).h = local_a38.h;
      (this->weight_data).c = local_a38.c;
      (this->weight_data).cstep = local_a38.cstep;
    }
    if (local_a38.refcount != (int *)0x0) {
      LOCK();
      *local_a38.refcount = *local_a38.refcount + -1;
      UNLOCK();
      if (*local_a38.refcount == 0) {
        if (local_a38.allocator == (Allocator *)0x0) {
          if (local_a38.data != (void *)0x0) {
            free(local_a38.data);
          }
        }
        else {
          (*(local_a38.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_a38.elemsize._0_4_ = 0;
    local_a38.elemsize._4_4_ = 0;
    local_a38.elempack = 0;
    local_a38.data = (void *)0x0;
    local_a38.refcount._0_4_ = 0;
    local_a38.refcount._4_4_ = 0;
    local_a38.dims = 0;
    local_a38.w = 0;
    local_a38.h = 0;
    local_a38.c = 0;
    local_a38.cstep = 0;
    if ((char)local_9a0 != '\0') {
      return -100;
    }
  }
  if (this->use_int8_inference == true) {
    this_00 = &this->quantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_00,(long)this->group);
    this_01 = &this->dequantize_ops;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(this_01,(long)this->group);
    if (0 < this->group) {
      lVar11 = 0;
      do {
        pLVar8 = create_layer(0x39);
        (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar8;
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,
                       *(float *)((long)(this->bottom_blob_int8_scales).data + lVar11 * 4));
        pLVar8 = (this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
        (*(this_00->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar11]->_vptr_Layer[4])();
        lVar12 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar12);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar12);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar12);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar12) = 0;
          lVar12 = lVar12 + -0x48;
        } while (lVar12 != -0x40);
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->group);
    }
    if (0 < this->group) {
      local_9a0 = (vector<float,std::allocator<float>> *)&this->dequantize_scales;
      lVar11 = 0;
      do {
        pLVar8 = create_layer(0x3a);
        (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar11] = pLVar8;
        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + lVar11 * 4);
        fVar14 = 0.0;
        if (fVar1 != 0.0) {
          fVar14 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales).data + lVar11 * 4
                                            ));
        }
        local_998 = (void *)CONCAT44((int)((ulong)local_998 >> 0x20),fVar14);
        ParamDict::ParamDict(&local_930);
        ParamDict::set(&local_930,0,local_998._0_4_);
        ParamDict::set(&local_930,1,this->bias_term);
        ParamDict::set(&local_930,2,1);
        pLVar8 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        (*pLVar8->_vptr_Layer[2])(pLVar8,&local_930);
        sVar2 = (this->bias_data).elemsize;
        local_a38.data = (void *)(sVar2 * lVar11 + (long)(this->bias_data).data);
        local_a38.elempack = (this->bias_data).elempack;
        local_a38.allocator = (this->bias_data).allocator;
        uStack_9d8 = (undefined4)sVar2;
        uStack_9d4 = (undefined4)(sVar2 >> 0x20);
        local_a38.cstep = 1;
        local_a38.h = 1;
        local_a38.c = 1;
        local_a38.dims = 1;
        local_a38.w = 1;
        local_a38.elemsize._4_4_ = uStack_9d4;
        local_a38.elemsize._0_4_ = uStack_9d8;
        local_a38.refcount._4_4_ = 0;
        local_a38.refcount._0_4_ = 0;
        uStack_9d8 = 0;
        uStack_9d4 = 0;
        iStack_9d0 = 0;
        local_9e8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
        local_9e8.weights._0_4_ = 0;
        local_9e8.weights._4_4_ = 0;
        local_9c0 = 0;
        uStack_9b8 = 0;
        local_9b0 = 0;
        pLVar8 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        local_9c8 = local_a38.allocator;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_9e8,&local_a38);
        (*pLVar8->_vptr_Layer[3])(pLVar8,&local_9e8);
        ModelBin::~ModelBin(&local_9e8.super_ModelBin);
        pLVar8 = (this_01->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar11];
        (*pLVar8->_vptr_Layer[4])(pLVar8,local_9f0);
        __position._M_current =
             (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    (local_9a0,__position,(float *)&local_998);
        }
        else {
          *__position._M_current = local_998._0_4_;
          (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        piVar3 = (int *)CONCAT44(local_a38.refcount._4_4_,local_a38.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_a38.allocator == (Allocator *)0x0) {
              if (local_a38.data != (void *)0x0) {
                free(local_a38.data);
              }
            }
            else {
              (*(local_a38.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_a38.elemsize._0_4_ = 0;
        local_a38.elemsize._4_4_ = 0;
        local_a38.elempack = 0;
        local_a38.data = (void *)0x0;
        local_a38.refcount._0_4_ = 0;
        local_a38.refcount._4_4_ = 0;
        local_a38.dims = 0;
        local_a38.w = 0;
        local_a38.h = 0;
        local_a38.c = 0;
        local_a38.cstep = 0;
        lVar12 = 0x8c0;
        do {
          piVar3 = *(int **)((long)&local_930.params[0].v.data + lVar12);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              pvVar4 = *(void **)((long)&local_930.params[0].type + lVar12);
              plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar12);
              if (plVar5 == (long *)0x0) {
                if (pvVar4 != (void *)0x0) {
                  free(pvVar4);
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar12 + 4) = 0;
          *(undefined8 *)((long)&local_930.params[0].type + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.data + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.dims + lVar12) = 0;
          *(undefined8 *)((long)&local_930.params[0].v.h + lVar12) = 0;
          lVar12 = lVar12 + -0x48;
        } while (lVar12 != -0x40);
        lVar11 = lVar11 + 1;
      } while (lVar11 < this->group);
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);

            quantize_ops[g]->create_pipeline(opt);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;
            if (weight_data_int8_scales[g] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));

            dequantize_ops[g]->create_pipeline(opt);

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}